

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

pointer __thiscall
slang::SmallVectorBase<slang::ConstantRange>::emplaceRealloc<slang::ConstantRange>
          (SmallVectorBase<slang::ConstantRange> *this,pointer pos,ConstantRange *args)

{
  pointer pCVar1;
  ulong uVar2;
  ConstantRange *__cur_1;
  ConstantRange *pCVar3;
  ConstantRange *pCVar4;
  ConstantRange *pCVar5;
  ConstantRange CVar6;
  ConstantRange ctx;
  long lVar7;
  
  if (this->len == 0xfffffffffffffff) {
    detail::throwLengthError();
  }
  CVar6 = (ConstantRange)(this->len + 1);
  uVar2 = this->cap;
  ctx = (ConstantRange)(uVar2 * 2);
  if ((ulong)CVar6 < (ulong)ctx) {
    CVar6 = ctx;
  }
  if (0xfffffffffffffff - uVar2 < uVar2) {
    CVar6.left = -1;
    CVar6.right = 0xfffffff;
  }
  lVar7 = (long)pos - (long)this->data_;
  pCVar3 = (ConstantRange *)operator_new((long)CVar6 * 8);
  *(ConstantRange *)((long)pCVar3 + lVar7) = *args;
  pCVar5 = this->data_;
  pCVar1 = pCVar5 + this->len;
  pCVar4 = pCVar3;
  if (pCVar1 == pos) {
    for (; pCVar5 != pos; pCVar5 = pCVar5 + 1) {
      *pCVar4 = *pCVar5;
      pCVar4 = pCVar4 + 1;
    }
  }
  else {
    for (; pCVar5 != pos; pCVar5 = pCVar5 + 1) {
      ctx = *pCVar5;
      *pCVar4 = ctx;
      pCVar4 = pCVar4 + 1;
    }
    pCVar5 = (ConstantRange *)(lVar7 + (long)pCVar3);
    for (; pCVar5 = pCVar5 + 1, pos != pCVar1; pos = pos + 1) {
      *pCVar5 = *pos;
    }
  }
  cleanup(this,(EVP_PKEY_CTX *)ctx);
  this->len = this->len + 1;
  this->cap = (size_type)CVar6;
  this->data_ = pCVar3;
  return (pointer)((long)pCVar3 + lVar7);
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)::operator new(newCap * sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}